

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O2

int __thiscall nv::ColorBlock::init(ColorBlock *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d8d_for_Color32_0_0 *paVar4;
  ulong uVar5;
  int in_ECX;
  int in_EDX;
  uint uVar6;
  uint e;
  long lVar7;
  
  uVar2 = Image::width((Image *)ctx);
  uVar6 = uVar2 - in_EDX;
  if (3 < uVar2 - in_EDX) {
    uVar6 = 4;
  }
  uVar2 = Image::height((Image *)ctx);
  uVar3 = uVar2 - in_ECX;
  if (3 < uVar2 - in_ECX) {
    uVar3 = 4;
  }
  for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
    iVar1 = init::remainder[uVar5 | uVar3 * 4 - 4];
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      paVar4 = (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d8d_for_Color32_0_0 *)
               Image::pixel((Image *)ctx,init::remainder[lVar7 + (ulong)(uVar6 * 4 - 4)] + in_EDX,
                            iVar1 + in_ECX);
      ((anon_union_4_2_12391d8d_for_Color32_0 *)((long)this + lVar7 * 4))->field_0 = *paVar4;
    }
    this = (ColorBlock *)((long)this + 0x10);
  }
  return 4;
}

Assistant:

void ColorBlock::init(const Image * img, uint x, uint y)
{
	nvDebugCheck(img != NULL);
	
	const uint bw = min(img->width() - x, 4U);
	const uint bh = min(img->height() - y, 4U);

	nvDebugCheck(bw != 0);
	nvDebugCheck(bh != 0);

	static int remainder[] = {
		0, 0, 0, 0,
		0, 1, 0, 1,
		0, 1, 2, 0,
		0, 1, 2, 3,
	};

	// Blocks that are smaller than 4x4 are handled by repeating the pixels.
	// @@ Thats only correct when block size is 1, 2 or 4, but not with 3. :(

	for(uint i = 0; i < 4; i++) {
		//const int by = i % bh;
		const int by = remainder[(bh - 1) * 4 + i];
		for(uint e = 0; e < 4; e++) {
			//const int bx = e % bw;
			const int bx = remainder[(bw - 1) * 4 + e];
			color(e, i) = img->pixel(x + bx, y + by);
		}
	}
}